

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

void __thiscall
dg::pta::PointerAnalysisFS::PointerAnalysisFS
          (PointerAnalysisFS *this,PointerGraph *ps,PointerAnalysisOptions *opts)

{
  PointerGraph *in_RDX;
  PointerGraph *in_RSI;
  PointerAnalysis *in_RDI;
  PointerAnalysisOptions *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffffa8;
  vector<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>,_std::allocator<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  PointerAnalysisOptions::setPreprocessGeps((PointerAnalysisOptions *)in_RDX,false);
  PointerAnalysisOptions::PointerAnalysisOptions
            ((PointerAnalysisOptions *)in_RDX,in_stack_ffffffffffffff78);
  PointerAnalysis::PointerAnalysis(in_RDI,in_RSI,(PointerAnalysisOptions *)in_RDX);
  PointerAnalysisOptions::~PointerAnalysisOptions((PointerAnalysisOptions *)0x16a78f);
  in_RDI->_vptr_PointerAnalysis = (_func_int **)&PTR__PointerAnalysisFS_00197948;
  std::
  vector<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>,_std::allocator<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>_>_>
  ::vector((vector<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>,_std::allocator<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>_>_>
            *)0x16a7ae);
  PointerGraph::size(in_RDX);
  std::
  vector<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>,_std::allocator<std::unique_ptr<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>,_std::default_delete<std::map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>_>_>_>_>
  ::reserve(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  dg::pta::PointerGraph::computeLoops();
  return;
}

Assistant:

PointerAnalysisFS(PointerGraph *ps, PointerAnalysisOptions opts)
            : PointerAnalysis(ps, opts.setPreprocessGeps(false)) {
        assert(opts.preprocessGeps == false &&
               "Preprocessing GEPs does not work correctly for FS analysis");
        memoryMaps.reserve(ps->size() / 5);
        ps->computeLoops();
    }